

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * amrex::intersect(BoxArray *__return_storage_ptr__,BoxArray *ba,Box *b,IntVect *ng)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxArray::intersections(ba,b,&isects,false,ng);
  uVar3 = (uint)((ulong)((long)isects.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  BoxArray::BoxArray(__return_storage_ptr__,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar1 = 4;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      BoxArray::set(__return_storage_ptr__,(int)uVar2,
                    (Box *)((long)((isects.
                                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                  vect + lVar1 + -4));
      lVar1 = lVar1 + 0x20;
    }
  }
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  return __return_storage_ptr__;
}

Assistant:

BoxArray
intersect (const BoxArray& ba,
           const Box&      b,
           const IntVect&  ng)
{
    std::vector< std::pair<int,Box> > isects;

    ba.intersections(b,isects,false,ng);

    const int N = isects.size();

    BoxArray r(N);

    if (N > 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++)
        {
            r.set(i, isects[i].second);
        }
    }

    return r;
}